

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_XO.cpp
# Opt level: O0

void example::learning_XO(void)

{
  longdouble lVar1;
  undefined1 acceptableError [16];
  undefined1 learningRate [16];
  undefined1 adaptiveLearningRate [16];
  int iVar2;
  tensor ppplVar3;
  ostream *poVar4;
  Convolution2D *pCVar5;
  FullyConnected *this;
  Loss *this_00;
  tensor ppplVar6;
  char *__to;
  undefined2 in_stack_fffffffffffffe62;
  undefined4 in_stack_fffffffffffffe64;
  undefined6 in_stack_fffffffffffffe72;
  Layer *local_108;
  undefined1 local_b8 [8];
  SequentialModule module;
  int x_2;
  int y_2;
  int x_1;
  int y_1;
  int d;
  int y;
  int x;
  int i;
  tensor out [2];
  tensor in [2];
  
  out[1] = type::createTensor(8,8,1);
  ppplVar3 = type::createTensor(8,8,1);
  _x = type::createTensor(2,1,1);
  out[0] = type::createTensor(2,1,1);
  for (y = 0; y < 8; y = y + 1) {
    (*out[1])[y][y] = (longdouble)1;
    (*out[1])[7 - y][y] = (longdouble)1;
  }
  ***_x = (longdouble)1;
  (**_x)[1] = (longdouble)0;
  d = 0;
  y_1 = 3;
  x_1 = 2;
  while (d <= y_1) {
    lVar1 = (longdouble)1;
    (*ppplVar3)[(long)d + 4][(long)y_1 + 4] = lVar1;
    (*ppplVar3)[(long)y_1 + 4][(long)d + 4] = lVar1;
    (*ppplVar3)[4 - d][(long)y_1 + 4] = lVar1;
    (*ppplVar3)[4 - y_1][(long)d + 4] = lVar1;
    (*ppplVar3)[(long)d + 4][4 - y_1] = lVar1;
    (*ppplVar3)[(long)y_1 + 4][4 - d] = lVar1;
    (*ppplVar3)[4 - d][4 - y_1] = lVar1;
    (*ppplVar3)[4 - y_1][4 - d] = lVar1;
    if (SBORROW4(x_1,d * 2) == x_1 + d * -2 < 0) {
      iVar2 = -(d * 2 + 1);
      d = d + 1;
    }
    else {
      if (SBORROW4(x_1,(3 - y_1) * 2) == x_1 + (3 - y_1) * -2 < 0) {
        iVar2 = ((y_1 - d) + -1) * 2;
        d = d + 1;
      }
      else {
        iVar2 = y_1 * 2 + -1;
      }
      y_1 = y_1 + -1;
    }
    x_1 = x_1 + iVar2;
  }
  ***out[0] = (longdouble)0;
  (**out[0])[1] = (longdouble)1;
  for (y_2 = 0; y_2 < 8; y_2 = y_2 + 1) {
    for (x_2 = 0; x_2 < 8; x_2 = x_2 + 1) {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(*out[1])[y_2][x_2]);
      std::operator<<(poVar4,' ');
    }
    std::operator<<((ostream *)&std::cout,'\n');
  }
  std::operator<<((ostream *)&std::cout,'\n');
  std::operator<<((ostream *)&std::cout,'\n');
  for (module._adaptiveLearningRate._12_4_ = 0; module._adaptiveLearningRate._12_4_ < 8;
      module._adaptiveLearningRate._12_4_ = module._adaptiveLearningRate._12_4_ + 1) {
    for (module._adaptiveLearningRate._8_4_ = 0; module._adaptiveLearningRate._8_4_ < 8;
        module._adaptiveLearningRate._8_4_ = module._adaptiveLearningRate._8_4_ + 1) {
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          (*ppplVar3)[module._adaptiveLearningRate._12_4_]
                          [module._adaptiveLearningRate._8_4_]);
      std::operator<<(poVar4,' ');
    }
    std::operator<<((ostream *)&std::cout,'\n');
  }
  function::tool::initParamRandTool(-0.1,0.1);
  function::tool::initRandTool(0x76c2e);
  ::module::SequentialModule::SequentialModule((SequentialModule *)local_b8);
  acceptableError._10_2_ = in_stack_fffffffffffffe62;
  acceptableError._0_10_ = (longdouble)0.001;
  acceptableError._12_4_ = in_stack_fffffffffffffe64;
  ::module::SequentialModule::setStopParameter
            ((SequentialModule *)local_b8,500,(scalar)acceptableError);
  learningRate._10_2_ = in_stack_fffffffffffffe62;
  learningRate._0_10_ = (longdouble)0.2;
  learningRate._12_4_ = in_stack_fffffffffffffe64;
  adaptiveLearningRate._10_6_ = in_stack_fffffffffffffe72;
  adaptiveLearningRate._0_10_ = (longdouble)1e-10;
  ::module::SequentialModule::setTrainingParameter
            ((SequentialModule *)local_b8,(scalar)learningRate,(scalar)adaptiveLearningRate);
  ::module::SequentialModule::setInput((SequentialModule *)local_b8,8,8,1);
  pCVar5 = (Convolution2D *)operator_new(0x88);
  layer::Convolution2D::Convolution2D(pCVar5,2,3,3,2,0,0,1,1);
  ::module::SequentialModule::add((SequentialModule *)local_b8,(Layer *)pCVar5);
  pCVar5 = (Convolution2D *)operator_new(0x88);
  layer::Convolution2D::Convolution2D(pCVar5,2,3,3,2,0,0,1,1);
  ::module::SequentialModule::add((SequentialModule *)local_b8,(Layer *)pCVar5);
  this = (FullyConnected *)operator_new(0x78);
  layer::FullyConnected::FullyConnected(this,8,2,true);
  ::module::SequentialModule::add((SequentialModule *)local_b8,(Layer *)this);
  this_00 = (Loss *)operator_new(0x88);
  layer::Loss::Loss(this_00,2,2,2,true);
  local_108 = (Layer *)0x0;
  if (this_00 != (Loss *)0x0) {
    local_108 = (Layer *)((long)&this_00->_vptr_Loss + (long)this_00->_vptr_Loss[-3]);
  }
  ::module::SequentialModule::add((SequentialModule *)local_b8,local_108);
  ::module::SequentialModule::link((SequentialModule *)local_b8,(char *)local_108,__to);
  poVar4 = std::operator<<((ostream *)&std::cout,'a');
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  ::module::SequentialModule::training((SequentialModule *)local_b8,out + 1,(tensor *)&x,2,1.0);
  poVar4 = std::operator<<((ostream *)&std::cout,'b');
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"- Resulta: ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  ::module::SequentialModule::predict((SequentialModule *)local_b8,out[1]);
  poVar4 = std::operator<<((ostream *)&std::cout,"  X : ");
  ppplVar6 = ::module::SequentialModule::getOut((SequentialModule *)local_b8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,***ppplVar6);
  poVar4 = std::operator<<(poVar4,", ");
  ppplVar6 = ::module::SequentialModule::getOut((SequentialModule *)local_b8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(**ppplVar6)[1]);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  ::module::SequentialModule::predict((SequentialModule *)local_b8,ppplVar3);
  poVar4 = std::operator<<((ostream *)&std::cout,"  O : ");
  ppplVar3 = ::module::SequentialModule::getOut((SequentialModule *)local_b8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,***ppplVar3);
  poVar4 = std::operator<<(poVar4,", ");
  ppplVar3 = ::module::SequentialModule::getOut((SequentialModule *)local_b8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(**ppplVar3)[1]);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  ::module::SequentialModule::~SequentialModule((SequentialModule *)local_b8);
  return;
}

Assistant:

void learning_XO()
    {
        type::tensor in[2];
        in[0] = type::createTensor(8, 8, 1);
        in[1] = type::createTensor(8, 8, 1);

        type::tensor out[2];
        out[0] = type::createTensor(2, 1, 1);
        out[1] = type::createTensor(2, 1, 1);

        for(int i(0); i < 8; i++){
            (*in[0])[i][i] = 1;
            (*in[0])[7 - i][i] = 1;
        }
        (**out[0])[0] = 1;
        (**out[0])[1] = 0;

        {
            int x = 0;
            int y = 3;
            int d = 3 - 1;
            while (y >= x)
            {
                (*in[1])[4 + x][4 + y] = 1;
                (*in[1])[4 + y][4 + x] = 1;
                (*in[1])[4 - x][4 + y] = 1;
                (*in[1])[4 - y][4 + x] = 1;
                (*in[1])[4 + x][4 - y] = 1;
                (*in[1])[4 + y][4 - x] = 1;
                (*in[1])[4 - x][4 - y] = 1;
                (*in[1])[4 - y][4 - x] = 1;

                if (d >= 2 * x)
                {
                    d -= 2 * x + 1;
                    x++;
                }
                else if (d < 2 * (3 - y))
                {
                    d += 2 * y - 1;
                    y--;
                }
                else
                {
                    d += 2 * (y - x - 1);
                    y--;
                    x++;
                }
            }
        }
        (**out[1])[0] = 0;
        (**out[1])[1] = 1;

        for(int y(0); y < 8; y++) {
            for(int x(0); x < 8; x++) {
                std::cout << (*in[0])[y][x] << ' ';
            }
            std::cout << '\n';
        }
        std::cout << '\n';
        std::cout << '\n';

        for(int y(0); y < 8; y++) {
            for(int x(0); x < 8; x++) {
                std::cout << (*in[1])[y][x] << ' ';
            }
            std::cout << '\n';
        }

        function::tool::initParamRandTool(-0.1, 0.1);
        function::tool::initRandTool(486446);
        module::SequentialModule module;
        module.setStopParameter(500, 0.001);
        module.setTrainingParameter(0.2, 0.0000000001);
        module.setInput(8, 8, 1);
        module.add(new layer::Convolution2D(2, 3, 3, ACTIVATION_SIGMOIDE, 0, 0, 1, 1));
        module.add(new layer::Convolution2D(2, 3, 3, ACTIVATION_SIGMOIDE, 0, 0, 1, 1));
        module.add(new layer::FullyConnected(8, ACTIVATION_SIGMOIDE, true));
        module.add(new layer::Loss(2, ACTIVATION_SIGMOIDE, LOSS_LOGLOSS, true));
        module.link();

        std::cout << 'a' << std::endl;
        module.training(in, out, 2, 1);
        std::cout << 'b' << std::endl;

        std::cout << "- Resulta: " << std::endl;
        module.predict(in[0]);
        std::cout << "  X : " << (**module.getOut())[0] << ", " << (**module.getOut())[1] << std::endl;
        module.predict(in[1]);
        std::cout << "  O : " << (**module.getOut())[0] << ", " << (**module.getOut())[1] << std::endl;



    }